

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O0

Production * __thiscall
SGParser::Generator::Production::operator=(Production *this,Production *source)

{
  uint uVar1;
  Production *source_local;
  Production *this_local;
  
  if (this->pRight != source->pRight) {
    if (((this->pRight != (uint *)0x0) &&
        (uVar1 = *this->pRight - 1, *this->pRight = uVar1, uVar1 == 0)) &&
       (this->pRight != (uint *)0x0)) {
      operator_delete__(this->pRight);
    }
    this->pRight = source->pRight;
    if (this->pRight != (uint *)0x0) {
      *this->pRight = *this->pRight + 1;
    }
  }
  std::__cxx11::string::operator=((string *)this,(string *)source);
  this->Id = source->Id;
  this->Precedence = source->Precedence;
  this->Left = source->Left;
  this->Length = source->Length;
  this->Line = source->Line;
  this->NotReported = (bool)(source->NotReported & 1);
  this->ErrorTerminal = source->ErrorTerminal;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (&this->LeftChain,&source->LeftChain);
  std::
  map<unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
  ::operator=(&this->ReduceOverrides,&source->ReduceOverrides);
  std::
  map<unsigned_int,_SGParser::Generator::Production::ConflictAction,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SGParser::Generator::Production::ConflictAction>_>_>
  ::operator=(&this->ConflictActions,&source->ConflictActions);
  return this;
}

Assistant:

Production& Production::operator=(const Production& source) {
    // Destroy previous pRight, assign new one
    if (pRight != source.pRight) {
        if (pRight)
            if (!(--pRight[0u]))
                delete[] pRight;

        if (pRight = source.pRight; pRight != nullptr)
            ++pRight[0u];
    }

    Name            = source.Name;
    Id              = source.Id;
    Precedence      = source.Precedence;
    Left            = source.Left;
    Length          = source.Length;
    Line            = source.Line;
    NotReported     = source.NotReported;
    ErrorTerminal   = source.ErrorTerminal;
    LeftChain       = source.LeftChain;
    ReduceOverrides = source.ReduceOverrides;
    ConflictActions = source.ConflictActions;

    return *this;
}